

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

bool wasm::anon_unknown_24::isUninhabitable
               (Type type,
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               *visited,unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *visiting)

{
  bool bVar1;
  HeapType HVar2;
  uint uVar3;
  Type local_20;
  Type type_local;
  
  if ((type.id & 3) == 0 && 6 < type.id) {
    local_20.id = type.id;
    HVar2 = Type::getHeapType(&local_20);
    if ((0x7c < HVar2.id) ||
       (uVar3 = (uint)HVar2.id & 0x7b, bVar1 = true, 4 < (uVar3 << 0x1d | uVar3 - 8 >> 3) - 10)) {
      HVar2 = Type::getHeapType(&local_20);
      bVar1 = true;
      if (0x7c < HVar2.id || ((uint)HVar2.id & 0x7b) != 8) {
        HVar2 = Type::getHeapType(&local_20);
        bVar1 = isUninhabitable(HVar2,visited,visiting);
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isUninhabitable(Type type,
                     std::unordered_set<HeapType>& visited,
                     std::unordered_set<HeapType>& visiting) {
  if (type.isRef() && type.isNonNullable()) {
    if (type.getHeapType().isBottom() ||
        type.getHeapType().isMaybeShared(HeapType::ext)) {
      return true;
    }
    return isUninhabitable(type.getHeapType(), visited, visiting);
  }
  return false;
}